

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp.c
# Opt level: O3

void csp_rdp_get_opt(uint *window_size,uint *conn_timeout_ms,uint *packet_timeout_ms,
                    uint *delayed_acks,uint *ack_timeout,uint *ack_delay_count)

{
  if (window_size != (uint *)0x0) {
    *window_size = csp_rdp_window_size;
  }
  if (conn_timeout_ms != (uint *)0x0) {
    *conn_timeout_ms = csp_rdp_conn_timeout;
  }
  if (packet_timeout_ms != (uint *)0x0) {
    *packet_timeout_ms = csp_rdp_packet_timeout;
  }
  if (delayed_acks != (uint *)0x0) {
    *delayed_acks = csp_rdp_delayed_acks;
  }
  if (ack_timeout != (uint *)0x0) {
    *ack_timeout = csp_rdp_ack_timeout;
  }
  if (ack_delay_count != (uint *)0x0) {
    *ack_delay_count = csp_rdp_ack_delay_count;
  }
  return;
}

Assistant:

void csp_rdp_get_opt(unsigned int * window_size, unsigned int * conn_timeout_ms,
					 unsigned int * packet_timeout_ms, unsigned int * delayed_acks,
					 unsigned int * ack_timeout, unsigned int * ack_delay_count) {

	if (window_size)
		*window_size = csp_rdp_window_size;
	if (conn_timeout_ms)
		*conn_timeout_ms = csp_rdp_conn_timeout;
	if (packet_timeout_ms)
		*packet_timeout_ms = csp_rdp_packet_timeout;
	if (delayed_acks)
		*delayed_acks = csp_rdp_delayed_acks;
	if (ack_timeout)
		*ack_timeout = csp_rdp_ack_timeout;
	if (ack_delay_count)
		*ack_delay_count = csp_rdp_ack_delay_count;
}